

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

size_t phf_primeup(size_t n)

{
  bool bVar1;
  ulong n_00;
  ulong uVar2;
  uint64_t t;
  long lVar3;
  
  if (0x3ffffffe < n >> 2) {
    return 0;
  }
  do {
LAB_00113374:
    do {
      while( true ) {
        n_00 = n;
        n = n_00 + 1;
        if (n == 0) {
          return 0xffffffffffffffff;
        }
        uVar2 = 2;
        if (7 < n_00) break;
        if ((0xaeUL >> (n_00 & 0x3f) & 1) != 0) {
          return n_00;
        }
      }
      for (; uVar2 != 8; uVar2 = uVar2 + 1) {
        if (((0x51UL >> (uVar2 & 0x3f) & 1) == 0) &&
           (n_00 % (ulong)(long)*(char *)((long)&phf_isprime(unsigned_long)::map + uVar2) == 0))
        goto LAB_00113374;
      }
      if (n_00 >> 0x20 != 0) {
        __assert_fail("n <= UINT32_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                      ,0x93,"bool phf_rabinmiller(uint64_t)");
      }
    } while ((n_00 & 1) == 0);
    t = 0;
    for (uVar2 = n_00 - 1; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1) {
      t = t + 1;
    }
    if (n_00 < 0x7eb) {
      bVar1 = phf_witness(n_00,2,uVar2,t);
      if (bVar1) {
        return n_00;
      }
      goto LAB_00113374;
    }
    lVar3 = 0;
    do {
      if (lVar3 == 0xc) {
        return n_00;
      }
      bVar1 = phf_witness(n_00,(long)*(int *)((long)&phf_rabinmiller(unsigned_long)::witness + lVar3
                                             ),uVar2,t);
      lVar3 = lVar3 + 4;
    } while (bVar1);
  } while( true );
}

Assistant:

static inline size_t phf_primeup(size_t n) {
	/* NB: 4294967291 is largest 32-bit prime */
	if (n > 4294967291)
		return 0;

	while (n < SIZE_MAX && !phf_isprime(n))
		n++;

	return n;
}